

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

SHADING_RATE Diligent::VkFragmentSizeToShadingRate(VkExtent2D *Size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  string msg;
  string local_48;
  
  uVar3 = Size->width;
  uVar4 = uVar3 - 1;
  if (((uVar3 ^ uVar4) <= uVar4) || (uVar4 = Size->height, (uVar4 ^ uVar4 - 1) <= uVar4 - 1)) {
    FormatString<char[26],char[54]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height)",
               (char (*) [54])(ulong)uVar4);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    uVar3 = Size->width;
    uVar4 = Size->height;
  }
  uVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (uVar3 == 0) {
    uVar1 = 0x20;
  }
  uVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  if (uVar4 == 0) {
    uVar2 = 0x20;
  }
  if (1 << ((byte)uVar1 & 0x1f) != uVar3) {
    FormatString<char[26],char[24]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << X) == Size.width",(char (*) [24])(ulong)uVar1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (1 << ((SHADING_RATE)uVar2 & 0x1f) != Size->height) {
    FormatString<char[26],char[25]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << Y) == Size.height",(char (*) [25])(ulong)uVar2);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return (SHADING_RATE)(uVar1 << 2) | (SHADING_RATE)uVar2;
}

Assistant:

SHADING_RATE VkFragmentSizeToShadingRate(const VkExtent2D& Size)
{
    VERIFY_EXPR(IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height));
    uint32_t X = PlatformMisc::GetMSB(Size.width);
    uint32_t Y = PlatformMisc::GetMSB(Size.height);
    VERIFY_EXPR((1u << X) == Size.width);
    VERIFY_EXPR((1u << Y) == Size.height);
    return static_cast<SHADING_RATE>((X << SHADING_RATE_X_SHIFT) | Y);
}